

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

SyntaxTreeNode * __thiscall Parser::parseProgram(Parser *this,string *program)

{
  char cVar1;
  SyntaxTreeNode *current;
  string line;
  stringstream splitter;
  string local_1d0;
  long local_1b0 [4];
  byte abStack_190 [96];
  ios_base local_130 [264];
  
  current = (SyntaxTreeNode *)operator_new(0x48);
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (current->children).super__Vector_base<SyntaxTreeNode_*,_std::allocator<SyntaxTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (current->data)._M_dataplus._M_p = (pointer)&(current->data).field_2;
  (current->data)._M_string_length = 0;
  (current->data).field_2._M_local_buf[0] = '\0';
  current->nonTerminal = 0x4ff7a;
  current->parent = (SyntaxTreeNode *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0,(string *)program,_S_out|_S_in)
  ;
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0) {
    do {
      local_1d0._M_string_length = 0;
      local_1d0.field_2._M_local_buf[0] = '\0';
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                              (char)(stringstream *)local_1b0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b0,(string *)&local_1d0,cVar1);
      current = parseLine(this,&local_1d0,current);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                                 local_1d0.field_2._M_local_buf[0]) + 1);
      }
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return current;
}

Assistant:

SyntaxTreeNode *Parser::parseProgram(const std::string &program) {
    auto *programTree = new SyntaxTreeNode(PROGRAM);
    std::stringstream splitter(program);
    while (!splitter.eof()) {
        std::string line;
        getline(splitter, line);
        programTree = parseLine(line, programTree);
    }
    return programTree;
}